

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainerSingleThread.cpp
# Opt level: O0

void __thiscall adios2::burstbuffer::FileDrainerSingleThread::Join(FileDrainerSingleThread *this)

{
  bool bVar1;
  ostream *poVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  type this_00;
  rep_conflict rVar3;
  TimePoint tTotalEnd;
  Seconds timeTotal;
  TimePoint tTotalStart;
  thread *in_stack_ffffffffffffffc0;
  duration<double,_std::ratio<1L,_1L>_> local_18;
  duration local_10;
  
  bVar1 = std::thread::joinable(in_stack_ffffffffffffffc0);
  if (bVar1) {
    local_10.__r = (rep_conflict)core::Now();
    memset(&local_18,0,8);
    (**(code **)((long)(in_RDI->__d).__r + 0x18))();
    std::thread::join();
    core::Now();
    this_00 = std::chrono::operator-
                        (in_RDI,(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_ffffffffffffffc0);
    std::chrono::duration<double,std::ratio<1l,1l>>::
    duration<double,std::ratio<1l,1000000000l>,void>
              ((duration<double,_std::ratio<1L,_1L>_> *)this_00.__r,&in_RDI->__d);
    if (*(int *)((long)&in_RDI[0x10].__d.__r + 4) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Drain ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&in_RDI[0x10].__d.__r);
      poVar2 = std::operator<<(poVar2,": Waited for thread to join = ");
      rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_18);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
      poVar2 = std::operator<<(poVar2," seconds");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void FileDrainerSingleThread::Join()
{
    if (th.joinable())
    {
        const auto tTotalStart = core::Now();
        core::Seconds timeTotal(0.0);

        Finish();
        th.join();

        const auto tTotalEnd = core::Now();
        timeTotal = tTotalEnd - tTotalStart;
        if (m_Verbose)
        {
#ifndef NO_SANITIZE_THREAD
            std::cout << "Drain " << m_Rank << ": Waited for thread to join = " << timeTotal.count()
                      << " seconds" << std::endl;
#endif
        }
    }
}